

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llil.cc
# Opt level: O0

int main(int argc,char **argv)

{
  anon_class_24_3_6cdad077 local_1958;
  string_view local_1940;
  show_time<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_examples_llil_cc:450:38)>
  local_1929;
  undefined1 local_1928 [8];
  llil_t<32UL> llil;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  llil.consumers._M_elems[0x1f]._144_8_ = argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cerr,"usage: llil4map file1 file2 ... >out.txt\n");
    argv_local._4_4_ = 1;
  }
  else {
    llil_t<32UL>::llil_t((llil_t<32UL> *)local_1928);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1940,"get properties      ");
    local_1958.argv = (char ***)&llil.consumers._M_elems[0x1f].done;
    local_1958.argc = (int *)&argv_local;
    local_1958.llil = (llil_t<32UL> *)local_1928;
    show_time<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/examples/llil.cc:450:38)>
    ::show_time(&local_1929,local_1940,&local_1958);
    argv_local._4_4_ = 0;
    llil_t<32UL>::~llil_t((llil_t<32UL> *)local_1928);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
   if (argc < 2) { std::cerr << "usage: llil4map file1 file2 ... >out.txt\n";  return 1; }

   llil_t<32> llil;

   show_time("get properties      ", [&]() { llil.get_properties<6>(&argv[1], argc - 1); });

   return 0;
}